

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_ASCIIHexDecoder.cc
# Opt level: O1

void __thiscall Pl_ASCIIHexDecoder::flush(Pl_ASCIIHexDecoder *this)

{
  Pipeline *pPVar1;
  int i;
  long lVar2;
  int iVar3;
  int iVar4;
  uchar ch;
  int b [2];
  char local_9;
  int local_8 [2];
  
  if (this->pos != 0) {
    lVar2 = 0;
    do {
      iVar3 = (int)this->inbuf[lVar2];
      iVar4 = iVar3 + -0x37;
      if (iVar3 < 0x41) {
        iVar4 = iVar3 + -0x30;
      }
      local_8[lVar2] = iVar4;
      lVar2 = lVar2 + 1;
    } while (lVar2 == 1);
    local_9 = (char)(local_8[0] << 4) + (char)local_8[1];
    this->pos = 0;
    this->inbuf[0] = '0';
    this->inbuf[1] = '0';
    this->inbuf[2] = '\0';
    pPVar1 = (this->super_Pipeline).next_;
    (*pPVar1->_vptr_Pipeline[2])(pPVar1,&local_9,1);
  }
  return;
}

Assistant:

void
Pl_ASCIIHexDecoder::flush()
{
    if (this->pos == 0) {
        QTC::TC("libtests", "Pl_ASCIIHexDecoder no-op flush");
        return;
    }
    int b[2];
    for (int i = 0; i < 2; ++i) {
        if (this->inbuf[i] >= 'A') {
            b[i] = this->inbuf[i] - 'A' + 10;
        } else {
            b[i] = this->inbuf[i] - '0';
        }
    }
    auto ch = static_cast<unsigned char>((b[0] << 4) + b[1]);

    QTC::TC("libtests", "Pl_ASCIIHexDecoder partial flush", (this->pos == 2) ? 0 : 1);
    // Reset before calling getNext()->write in case that throws an exception.
    this->pos = 0;
    this->inbuf[0] = '0';
    this->inbuf[1] = '0';
    this->inbuf[2] = '\0';

    next()->write(&ch, 1);
}